

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_tests.cpp
# Opt level: O1

void __thiscall
sock_tests::constructor_and_destructor::test_method(constructor_and_destructor *this)

{
  SOCKET s;
  int iVar1;
  Sock *this_00;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  socklen_t len;
  int type;
  check_type cVar4;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  lazy_ostream local_90;
  undefined1 *local_80;
  char **local_78;
  assertion_result local_70;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  s = CreateSocket();
  this_00 = (Sock *)operator_new(0x10);
  Sock::Sock(this_00,s);
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_40 = "";
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x29;
  file.m_begin = (iterator)&local_48;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)Sock::operator==(this_00,s);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_78 = &local_a0;
  local_a0 = "*sock == s";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_a8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar4,(size_t)&local_b0,0x29);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x2a;
  file_00.m_begin = (iterator)&local_c0;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d0,msg_00
            );
  local_a0 = (char *)CONCAT44(local_a0._4_4_,4);
  iVar1 = getsockopt(s,1,3,&local_90,(socklen_t *)&local_a0);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 != -1);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "!SocketIsClosed(s)";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_d8 = "";
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x0;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,_cVar4,(size_t)&local_e0,0x2a);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  (*this_00->_vptr_Sock[1])(this_00);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/sock_tests.cpp";
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x2c;
  file_01.m_begin = (iterator)&local_f0;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_100,
             msg_01);
  local_a0 = (char *)CONCAT44(local_a0._4_4_,4);
  iVar1 = getsockopt(s,1,3,&local_90,(socklen_t *)&local_a0);
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == -1);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = "SocketIsClosed(s)";
  local_98 = "";
  local_90.m_empty = false;
  local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3df0;
  local_80 = boost::unit_test::lazy_ostream::inst;
  local_78 = &local_a0;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_90,1,0,WARN,0xf6a793,(size_t)&stack0xfffffffffffffef0,0x2c);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(constructor_and_destructor)
{
    const SOCKET s = CreateSocket();
    Sock* sock = new Sock(s);
    BOOST_CHECK(*sock == s);
    BOOST_CHECK(!SocketIsClosed(s));
    delete sock;
    BOOST_CHECK(SocketIsClosed(s));
}